

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_Part::RS_Part
          (RS_Part *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  undefined8 uVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChBodyAuxRef *pCVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  ChBodyAuxRef *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->m_name).field_2;
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_0017d9d0;
  (this->m_name)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + name->_M_string_length);
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  p_Var3 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  auVar9 = ZEXT864(0) << 0x20;
  *(undefined1 (*) [64])
   &(this->m_spheres).
    super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar9;
  this->m_boxes =
       (vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>)
       auVar9._0_24_;
  this->m_spheres =
       (vector<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>)
       auVar9._24_24_;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._48_8_;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar9._56_8_;
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)&(this->m_mesh_name).field_2;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  (this->m_offset).m_data[0] = 0.0;
  (this->m_offset).m_data[1] = 0.0;
  (this->m_offset).m_data[2] = 0.0;
  uVar1 = vmovlps_avx(auVar8);
  (this->m_color).R = (float)(int)uVar1;
  (this->m_color).G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_color).B = 1.0;
  local_58 = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBodyAuxRef*>
            (&_Stack_50,local_58);
  _Var7._M_pi = _Stack_50._M_pi;
  pCVar6 = local_58;
  local_58 = (ChBodyAuxRef *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar6;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
    }
  }
  peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58 = (ChBodyAuxRef *)local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::_M_assign((string *)(peVar4 + 8));
  if (local_58 != (ChBodyAuxRef *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

RS_Part::RS_Part(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : m_name(name), m_mat(mat) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
}